

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

VerticalAlign
Rml::ComputeVerticalAlign
          (Property *property,float line_height,float font_size,float document_font_size,
          float dp_ratio,Vector2f vp_dimensions)

{
  code *pcVar1;
  bool bVar2;
  Units units;
  int iVar3;
  NumericValue value_00;
  float fVar4;
  float value;
  float dp_ratio_local;
  float document_font_size_local;
  float font_size_local;
  float line_height_local;
  Property *property_local;
  Vector2f vp_dimensions_local;
  
  units = operator&(property->unit,LENGTH);
  bVar2 = Any(units);
  if (bVar2) {
    value_00 = Property::GetNumericValue(property);
    fVar4 = ComputeLength(value_00,font_size,document_font_size,dp_ratio,vp_dimensions);
    Style::VerticalAlign::VerticalAlign((VerticalAlign *)&vp_dimensions_local,fVar4);
  }
  else if (property->unit == PERCENT) {
    fVar4 = Property::Get<float>(property);
    Style::VerticalAlign::VerticalAlign
              ((VerticalAlign *)&vp_dimensions_local,fVar4 * line_height * 0.01);
  }
  else {
    if ((property->unit != KEYWORD) &&
       (bVar2 = Assert("RMLUI_ASSERT(property->unit == Unit::KEYWORD)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                       ,0xc6), !bVar2)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar3 = Property::Get<int>(property);
    Style::VerticalAlign::VerticalAlign((VerticalAlign *)&vp_dimensions_local,(Type)iVar3);
  }
  return (VerticalAlign)vp_dimensions_local;
}

Assistant:

Style::VerticalAlign ComputeVerticalAlign(const Property* property, float line_height, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	if (Any(property->unit & Unit::LENGTH))
	{
		float value = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
		return Style::VerticalAlign(value);
	}
	else if (property->unit == Unit::PERCENT)
	{
		return Style::VerticalAlign(property->Get<float>() * line_height * 0.01f);
	}

	RMLUI_ASSERT(property->unit == Unit::KEYWORD);
	return Style::VerticalAlign((Style::VerticalAlign::Type)property->Get<int>());
}